

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadStream.cpp
# Opt level: O0

ssize_t __thiscall ReadStream::read(ReadStream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  long *plVar3;
  size_type sVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  int local_78;
  value_type local_4b;
  value_type local_4a;
  value_type local_49;
  undefined1 auStack_48 [7];
  char ch;
  __mbstate_t local_40;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int count_local;
  int position_local;
  ReadStream *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ivector;
  
  pcVar5 = (char *)CONCAT44(in_register_00000034,__fd);
  local_1c = (int)__buf;
  local_20 = (int)__nbytes;
  local_21 = 0;
  _count_local = pcVar5;
  this_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_48,(long)local_1c);
    std::istream::seekg(pcVar5,_auStack_48,local_40);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) == 0) {
      if ((*(int *)(pcVar5 + 0x20c) < local_20) || (local_20 < 0)) {
        local_78 = *(int *)(pcVar5 + 0x20c);
      }
      else {
        local_78 = *(int *)(pcVar5 + 0x20c) - local_20;
      }
      *(int *)(pcVar5 + 0x20c) = local_78;
      if (local_20 <= *(int *)(pcVar5 + 0x20c)) {
        while( true ) {
          plVar3 = (long *)std::istream::get(pcVar5);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
          if (!bVar2 || local_20 < 1) break;
          local_4a = local_49;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_4a);
          local_20 = local_20 + -1;
        }
        if ((0 < *(int *)(pcVar5 + 0x20c)) &&
           (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this),
           sVar4 == 0)) {
          for (; 0 < local_20; local_20 = local_20 + -1) {
            local_4b = local_49;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_4b);
          }
        }
      }
    }
  }
  return (ssize_t)this;
}

Assistant:

vector<unsigned char> ReadStream::read(int position, int count) {
        vector<unsigned char> ivector;

        if(!f.is_open())
            return ivector;

        f.seekg(position);
        if(f.eof())
            return ivector;

        size = (count > size || count < 0) ? size : size - count;
        if(count <= size) {
            char ch;
            while (f.get(ch) && count > 0) {
                ivector.push_back(ch);
                --count;
            }
            if(size > 0 && ivector.size() == 0) {
                while (count > 0) {
                    ivector.push_back(ch);
                    --count;
                }
            }
        }
        return ivector;
    }